

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetDbgSetImportId(DebugInfoManager *this)

{
  uint32_t uVar1;
  FeatureManager *pFVar2;
  
  pFVar2 = IRContext::get_feature_mgr(this->context_);
  uVar1 = pFVar2->extinst_importid_OpenCL100DebugInfo_;
  if (uVar1 == 0) {
    pFVar2 = IRContext::get_feature_mgr(this->context_);
    uVar1 = pFVar2->extinst_importid_Shader100DebugInfo_;
  }
  return uVar1;
}

Assistant:

uint32_t DebugInfoManager::GetDbgSetImportId() {
  uint32_t setId =
      context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo();
  if (setId == 0) {
    setId =
        context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo();
  }
  return setId;
}